

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  uint uVar1;
  int iVar2;
  time_t start_time;
  uchar *puVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uchar *local_70;
  uchar **local_68;
  size_t *local_60;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *local_58;
  ulong local_50;
  char *local_48;
  packet_requirev_state_t *local_40;
  LIBSSH2_USERAUTH_KBDINT_PROMPT **local_38;
  
  local_58 = response_callback;
  local_48 = user;
  start_time = time((time_t *)0x0);
  local_38 = &session->userauth_kybd_prompts;
  local_68 = &session->userauth_kybd_data;
  local_60 = &session->userauth_kybd_data_len;
  local_40 = &session->userauth_kybd_packet_requirev_state;
  local_50 = (ulong)user_len;
  do {
    if (session->userauth_kybd_state == libssh2_NB_state_idle) {
      session->userauth_kybd_auth_name = (uchar *)0x0;
      session->userauth_kybd_auth_instruction = (uchar *)0x0;
      session->userauth_kybd_num_prompts = 0;
      session->userauth_kybd_auth_failure = 1;
      ((packet_requirev_state_t *)(local_38 + 2))->start = 0;
      *local_38 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
      local_38[1] = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
      session->userauth_kybd_packet_len = (ulong)(user_len + 0x37);
      puVar3 = (uchar *)(*session->alloc)((ulong)(user_len + 0x37),&session->abstract);
      session->userauth_kybd_data = puVar3;
      if (puVar3 != (uchar *)0x0) {
        local_70 = puVar3 + 1;
        *puVar3 = '2';
        _libssh2_store_str(&local_70,local_48,local_50);
        _libssh2_store_str(&local_70,"ssh-connection",0xe);
        _libssh2_store_str(&local_70,"keyboard-interactive",0x14);
        _libssh2_store_u32(&local_70,0);
        _libssh2_store_u32(&local_70,0);
        session->userauth_kybd_state = libssh2_NB_state_created;
        goto LAB_00116c3b;
      }
      iVar2 = -6;
      pcVar4 = "Unable to allocate memory for keyboard-interactive authentication";
      local_70 = (uchar *)0x0;
LAB_00116f35:
      iVar2 = _libssh2_error(session,iVar2,pcVar4);
    }
    else {
LAB_00116c3b:
      if (session->userauth_kybd_state != libssh2_NB_state_created) goto LAB_00116ce3;
      iVar2 = _libssh2_transport_send
                        (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                         (uchar *)0x0,0);
      if (iVar2 != 0) {
        if (iVar2 == -0x25) {
LAB_00116f26:
          iVar2 = -0x25;
          pcVar4 = "Would block";
        }
        else {
          (*session->free)(session->userauth_kybd_data,&session->abstract);
          session->userauth_kybd_data = (uchar *)0x0;
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar2 = -7;
          pcVar4 = "Unable to send keyboard-interactive request";
        }
        goto LAB_00116f35;
      }
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      do {
        session->userauth_kybd_state = libssh2_NB_state_sent;
LAB_00116ce3:
        if (session->userauth_kybd_state == libssh2_NB_state_sent) {
          iVar2 = _libssh2_packet_requirev
                            (session,"43<",local_68,local_60,0,(uchar *)0x0,0,local_40);
          if (iVar2 == 0) {
            if (*local_60 != 0) {
              puVar3 = *local_68;
              if (*puVar3 != '3') {
                if (*puVar3 != '4') {
                  iVar2 = userauth_keyboard_interactive_decode_info_request(session);
                  if (-1 < iVar2) {
                    (*local_58)((char *)session->userauth_kybd_auth_name,
                                (int)session->userauth_kybd_auth_name_len,
                                (char *)session->userauth_kybd_auth_instruction,
                                (int)session->userauth_kybd_auth_instruction_len,
                                session->userauth_kybd_num_prompts,session->userauth_kybd_prompts,
                                session->userauth_kybd_responses,&session->abstract);
                    session->userauth_kybd_packet_len = 5;
                    if ((ulong)session->userauth_kybd_num_prompts != 0) {
                      sVar5 = 5;
                      lVar7 = 0;
                      do {
                        uVar1 = *(uint *)((long)&session->userauth_kybd_responses->length + lVar7);
                        if (-sVar5 - 5 < (ulong)uVar1) goto LAB_001170d6;
                        sVar5 = sVar5 + (uVar1 + 4);
                        session->userauth_kybd_packet_len = sVar5;
                        lVar7 = lVar7 + 0x10;
                      } while ((ulong)session->userauth_kybd_num_prompts << 4 != lVar7);
                    }
                    (*session->free)(session->userauth_kybd_data,&session->abstract);
                    local_70 = (uchar *)(*session->alloc)(session->userauth_kybd_packet_len,
                                                          &session->abstract);
                    session->userauth_kybd_data = local_70;
                    if (local_70 != (uchar *)0x0) {
                      *local_70 = '=';
                      local_70 = local_70 + 1;
                      _libssh2_store_u32(&local_70,session->userauth_kybd_num_prompts);
                      if (session->userauth_kybd_num_prompts != 0) {
                        lVar7 = 8;
                        uVar6 = 0;
                        do {
                          _libssh2_store_str(&local_70,
                                             *(char **)((long)session->userauth_kybd_responses +
                                                       lVar7 + -8),
                                             (ulong)*(uint *)((long)&session->
                                                  userauth_kybd_responses->text + lVar7));
                          uVar6 = uVar6 + 1;
                          lVar7 = lVar7 + 0x10;
                        } while (uVar6 < session->userauth_kybd_num_prompts);
                      }
                      session->userauth_kybd_state = libssh2_NB_state_sent1;
                      goto LAB_00116ef4;
                    }
LAB_001170d6:
                    iVar2 = -6;
                    pcVar4 = "Unable to allocate memory for keyboard-interactive response packet";
                    goto LAB_00116f85;
                  }
                  goto LAB_00116f8a;
                }
                (*session->free)(puVar3,&session->abstract);
                session->userauth_kybd_data = (uchar *)0x0;
                *(byte *)&session->state = (byte)session->state | 8;
                session->userauth_kybd_state = libssh2_NB_state_idle;
                iVar2 = 0;
                goto LAB_00116f3a;
              }
              (*session->free)(puVar3,&session->abstract);
              session->userauth_kybd_data = (uchar *)0x0;
              session->userauth_kybd_state = libssh2_NB_state_idle;
              iVar2 = -0x12;
              pcVar4 = "Authentication failed (keyboard-interactive)";
              goto LAB_00116f35;
            }
          }
          else if (iVar2 == -0x25) goto LAB_00116f26;
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar2 = -0x12;
          pcVar4 = "Waiting for keyboard USERAUTH response";
          goto LAB_00116f35;
        }
LAB_00116ef4:
        if (session->userauth_kybd_state == libssh2_NB_state_sent1) {
          iVar2 = _libssh2_transport_send
                            (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                             (uchar *)0x0,0);
          if (iVar2 == 0) {
            session->userauth_kybd_auth_failure = 0;
          }
          else {
            if (iVar2 == -0x25) goto LAB_00116f26;
            iVar2 = -7;
            pcVar4 = "Unable to send userauth-keyboard-interactive request";
LAB_00116f85:
            _libssh2_error(session,iVar2,pcVar4);
          }
        }
LAB_00116f8a:
        (*session->free)(session->userauth_kybd_data,&session->abstract);
        session->userauth_kybd_data = (uchar *)0x0;
        if ((session->userauth_kybd_prompts != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) &&
           (session->userauth_kybd_num_prompts != 0)) {
          lVar7 = 0;
          uVar6 = 0;
          do {
            (*session->free)(*(void **)((long)&session->userauth_kybd_prompts->text + lVar7),
                             &session->abstract);
            *(undefined8 *)((long)&session->userauth_kybd_prompts->text + lVar7) = 0;
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0x18;
          } while (uVar6 < session->userauth_kybd_num_prompts);
        }
        if ((session->userauth_kybd_responses != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) &&
           (session->userauth_kybd_num_prompts != 0)) {
          lVar7 = 0;
          uVar6 = 0;
          do {
            (*session->free)(*(void **)((long)&session->userauth_kybd_responses->text + lVar7),
                             &session->abstract);
            *(undefined8 *)((long)&session->userauth_kybd_responses->text + lVar7) = 0;
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0x10;
          } while (uVar6 < session->userauth_kybd_num_prompts);
        }
        if (session->userauth_kybd_prompts != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          (*session->free)(session->userauth_kybd_prompts,&session->abstract);
          session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
        }
        if (session->userauth_kybd_responses != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          (*session->free)(session->userauth_kybd_responses,&session->abstract);
          session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        if (session->userauth_kybd_auth_name != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_name,&session->abstract);
          session->userauth_kybd_auth_name = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
          session->userauth_kybd_auth_instruction = (uchar *)0x0;
        }
      } while (session->userauth_kybd_auth_failure == 0);
      session->userauth_kybd_state = libssh2_NB_state_idle;
      iVar2 = -1;
    }
LAB_00116f3a:
    if (iVar2 != -0x25) {
      return iVar2;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar2 = _libssh2_wait_socket(session,start_time);
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}